

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

ssize_t archive_write_pax_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  sparse_block_conflict *sb;
  uchar *p;
  ulong uStack_40;
  int ret;
  size_t total;
  size_t ws;
  pax *pax;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (*(long *)((long)pvVar1 + 0x48) != 0) {
    iVar3 = __archive_write_output
                      (a,*(void **)((long)pvVar1 + 0x40),*(size_t *)((long)pvVar1 + 0x48));
    if (iVar3 != 0) {
      return (long)iVar3;
    }
    iVar3 = __archive_write_nulls(a,*(size_t *)((long)pvVar1 + 0x58));
    if (iVar3 != 0) {
      return (long)iVar3;
    }
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
  }
  uStack_40 = 0;
  while( true ) {
    if (s <= uStack_40) {
      return uStack_40;
    }
    while( true ) {
      bVar4 = false;
      if (*(long *)((long)pvVar1 + 0x60) != 0) {
        bVar4 = *(long *)(*(long *)((long)pvVar1 + 0x60) + 0x18) == 0;
      }
      if (!bVar4) break;
      uVar2 = **(undefined8 **)((long)pvVar1 + 0x60);
      free(*(void **)((long)pvVar1 + 0x60));
      *(undefined8 *)((long)pvVar1 + 0x60) = uVar2;
    }
    if (*(long *)((long)pvVar1 + 0x60) == 0) break;
    total = s - uStack_40;
    if (*(ulong *)(*(long *)((long)pvVar1 + 0x60) + 0x18) < total) {
      total = *(size_t *)(*(long *)((long)pvVar1 + 0x60) + 0x18);
    }
    if (*(int *)(*(long *)((long)pvVar1 + 0x60) + 8) == 0) {
      iVar3 = __archive_write_output(a,(void *)((long)buff + uStack_40),total);
      *(size_t *)(*(long *)((long)pvVar1 + 0x60) + 0x18) =
           *(long *)(*(long *)((long)pvVar1 + 0x60) + 0x18) - total;
      uStack_40 = uStack_40 + total;
      if (iVar3 != 0) {
        return (long)iVar3;
      }
    }
    else {
      *(size_t *)(*(long *)((long)pvVar1 + 0x60) + 0x18) =
           *(long *)(*(long *)((long)pvVar1 + 0x60) + 0x18) - total;
      uStack_40 = uStack_40 + total;
    }
  }
  return uStack_40;
}

Assistant:

static ssize_t
archive_write_pax_data(struct archive_write *a, const void *buff, size_t s)
{
	struct pax *pax;
	size_t ws;
	size_t total;
	int ret;

	pax = (struct pax *)a->format_data;

	/*
	 * According to GNU PAX format 1.0, write a sparse map
	 * before the body.
	 */
	if (archive_strlen(&(pax->sparse_map))) {
		ret = __archive_write_output(a, pax->sparse_map.s,
		    archive_strlen(&(pax->sparse_map)));
		if (ret != ARCHIVE_OK)
			return (ret);
		ret = __archive_write_nulls(a, pax->sparse_map_padding);
		if (ret != ARCHIVE_OK)
			return (ret);
		archive_string_empty(&(pax->sparse_map));
	}

	total = 0;
	while (total < s) {
		const unsigned char *p;

		while (pax->sparse_list != NULL &&
		    pax->sparse_list->remaining == 0) {
			struct sparse_block *sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}

		if (pax->sparse_list == NULL)
			return (total);

		p = ((const unsigned char *)buff) + total;
		ws = s - total;
		if (ws > pax->sparse_list->remaining)
			ws = (size_t)pax->sparse_list->remaining;

		if (pax->sparse_list->is_hole) {
			/* Current block is hole thus we do not write
			 * the body. */
			pax->sparse_list->remaining -= ws;
			total += ws;
			continue;
		}

		ret = __archive_write_output(a, p, ws);
		pax->sparse_list->remaining -= ws;
		total += ws;
		if (ret != ARCHIVE_OK)
			return (ret);
	}
	return (total);
}